

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-ieee.h
# Opt level: O0

DiyFp __thiscall icu_63::double_conversion::Double::AsNormalizedDiyFp(Double *this)

{
  DiyFp DVar1;
  int local_2c;
  uint64_t uStack_28;
  int e;
  uint64_t f;
  Double *this_local;
  undefined4 local_10;
  
  uStack_28 = Significand(this);
  local_2c = Exponent(this);
  for (; (uStack_28 & 0x10000000000000) == 0; uStack_28 = uStack_28 << 1) {
    local_2c = local_2c + -1;
  }
  DiyFp::DiyFp((DiyFp *)&this_local,uStack_28 << 0xb,local_2c + -0xb);
  DVar1._12_4_ = 0;
  DVar1.f_ = (uint64_t)this_local;
  DVar1.e_ = local_10;
  return DVar1;
}

Assistant:

DiyFp AsNormalizedDiyFp() const {
    ASSERT(value() > 0.0);
    uint64_t f = Significand();
    int e = Exponent();

    // The current double could be a denormal.
    while ((f & kHiddenBit) == 0) {
      f <<= 1;
      e--;
    }
    // Do the final shifts in one go.
    f <<= DiyFp::kSignificandSize - kSignificandSize;
    e -= DiyFp::kSignificandSize - kSignificandSize;
    return DiyFp(f, e);
  }